

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

int Acb_DeriveCnfFromTruth(word Truth,int nVars,Vec_Int_t *vCover,Vec_Str_t *vCnf)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong local_58;
  int local_4c;
  int nCubes;
  int Cube;
  int Literal;
  int RetValue;
  int c;
  int k;
  int i;
  Vec_Str_t *vCnf_local;
  Vec_Int_t *vCover_local;
  word wStack_18;
  int nVars_local;
  word Truth_local;
  
  wStack_18 = Truth;
  Vec_StrClear(vCnf);
  if ((wStack_18 == 0) || (wStack_18 == 0xffffffffffffffff)) {
    Vec_StrPush(vCnf,wStack_18 == 0);
    Vec_StrPush(vCnf,-1);
    Truth_local._4_4_ = 1;
  }
  else {
    local_4c = 0;
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                    ,0x42,"int Acb_DeriveCnfFromTruth(word, int, Vec_Int_t *, Vec_Str_t *)");
    }
    for (Literal = 0; Literal < 2; Literal = Literal + 1) {
      if (Literal == 0) {
        local_58 = wStack_18;
      }
      else {
        local_58 = wStack_18 ^ 0xffffffffffffffff;
      }
      wStack_18 = local_58;
      iVar1 = Kit_TruthIsop((uint *)&stack0xffffffffffffffe8,nVars,vCover,0);
      if (iVar1 != 0) {
        __assert_fail("RetValue == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                      ,0x47,"int Acb_DeriveCnfFromTruth(word, int, Vec_Int_t *, Vec_Str_t *)");
      }
      iVar1 = Vec_IntSize(vCover);
      local_4c = iVar1 + local_4c;
      for (c = 0; iVar1 = Vec_IntSize(vCover), c < iVar1; c = c + 1) {
        iVar1 = Vec_IntEntry(vCover,c);
        for (RetValue = 0; RetValue < nVars; RetValue = RetValue + 1) {
          uVar2 = iVar1 >> ((byte)(RetValue << 1) & 0x1f) & 3;
          if (uVar2 == 1) {
            iVar3 = Abc_Var2Lit(RetValue,0);
            Vec_StrPush(vCnf,(char)iVar3);
          }
          else if (uVar2 == 2) {
            iVar3 = Abc_Var2Lit(RetValue,1);
            Vec_StrPush(vCnf,(char)iVar3);
          }
          else if (uVar2 != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                          ,0x53,"int Acb_DeriveCnfFromTruth(word, int, Vec_Int_t *, Vec_Str_t *)");
          }
        }
        iVar1 = Abc_Var2Lit(nVars,Literal);
        Vec_StrPush(vCnf,(char)iVar1);
        Vec_StrPush(vCnf,-1);
      }
    }
    Truth_local._4_4_ = local_4c;
  }
  return Truth_local._4_4_;
}

Assistant:

int Acb_DeriveCnfFromTruth( word Truth, int nVars, Vec_Int_t * vCover, Vec_Str_t * vCnf )
{
    Vec_StrClear( vCnf );
    if ( Truth == 0 || ~Truth == 0 )
    {
//        assert( nVars == 0 );
        Vec_StrPush( vCnf, (char)(Truth == 0) );
        Vec_StrPush( vCnf, (char)-1 );
        return 1;
    }
    else 
    {
        int i, k, c, RetValue, Literal, Cube, nCubes = 0;
        assert( nVars > 0 );
        for ( c = 0; c < 2; c ++ )
        {
            Truth = c ? ~Truth : Truth;
            RetValue = Kit_TruthIsop( (unsigned *)&Truth, nVars, vCover, 0 );
            assert( RetValue == 0 );
            nCubes += Vec_IntSize( vCover );
            Vec_IntForEachEntry( vCover, Cube, i )
            {
                for ( k = 0; k < nVars; k++ )
                {
                    Literal = 3 & (Cube >> (k << 1));
                    if ( Literal == 1 )      // '0'  -> pos lit
                        Vec_StrPush( vCnf, (char)Abc_Var2Lit(k, 0) );
                    else if ( Literal == 2 ) // '1'  -> neg lit
                        Vec_StrPush( vCnf, (char)Abc_Var2Lit(k, 1) );
                    else if ( Literal != 0 )
                        assert( 0 );
                }
                Vec_StrPush( vCnf, (char)Abc_Var2Lit(nVars, c) );
                Vec_StrPush( vCnf, (char)-1 );
            }
        }
        return nCubes;
    }
}